

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,4u>>(int bias)

{
  Counter<unsigned_char,_4U> local_117;
  Counter<unsigned_short,_16U> local_116;
  Counter<unsigned_short,_16U> local_114;
  undefined1 local_111;
  Counter<unsigned_short,_16U> local_110;
  Counter<unsigned_short,_16U> local_10e;
  int local_10c;
  int iStack_108;
  Counter<unsigned_short,_16U> expanded;
  int delta_1;
  int delta;
  Counter<unsigned_char,_4U> truncatedRecent;
  Counter<unsigned_short,_16U> fullRecent;
  uint recent;
  Counter<unsigned_char,_4U> truncatedOriginal;
  Counter<unsigned_short,_16U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  Counter<unsigned_short,_16U> local_c4;
  ushort local_c2;
  Counter<unsigned_short,_16U> local_c0;
  ushort local_be;
  ushort local_bc;
  unsigned_short absDiff_1;
  unsigned_short absDiff;
  unsigned_short recentLow;
  undefined1 *puStack_b8;
  Counter<unsigned_short,_16U> *local_b0;
  Counter<unsigned_short,_16U> *local_a8;
  ThisType *result;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  Counter<unsigned_short,_16U> *local_80;
  Counter<unsigned_short,_16U> *local_78;
  Counter<unsigned_short,_16U> *local_70;
  Counter<unsigned_short,_16U> *local_68;
  Counter<unsigned_short,_16U> *local_60;
  Counter<unsigned_short,_16U> *local_58;
  short local_4a;
  ushort local_48;
  byte local_46;
  byte local_45;
  short local_44;
  SignedType gapSigned;
  ValueType_conflict1 gapMSB;
  ValueType_conflict2 gap;
  ValueType_conflict2 smallRecent;
  SignedType smallerSigned;
  ValueType_conflict1 smallerMSB;
  Counter<unsigned_short,_16U> *local_38;
  Counter<unsigned_short,_16U> *local_30;
  Counter<unsigned_short,_16U> *local_28;
  Counter<unsigned_short,_16U> *local_20;
  Counter<unsigned_short,_16U> *local_18;
  Counter<unsigned_short,_16U> *local_10;
  
  recent = 0;
  do {
    if (0x1f < recent) {
      return true;
    }
    Counter<unsigned_short,_16U>::Counter(&fullRecent,(unsigned_short)recent);
    Counter<unsigned_char,_4U>::Counter(&truncatedRecent,'\0');
    Counter<unsigned_char,_4U>::operator=(&truncatedRecent,(uchar)fullRecent.Value);
    for (delta = 0; (uint)delta < 0x20; delta = delta + 1) {
      Counter<unsigned_short,_16U>::Counter
                ((Counter<unsigned_short,_16U> *)((long)&delta_1 + 2),(unsigned_short)delta);
      Counter<unsigned_char,_4U>::Counter((Counter<unsigned_char,_4U> *)((long)&delta_1 + 1),'\0');
      Counter<unsigned_char,_4U>::operator=
                ((Counter<unsigned_char,_4U> *)((long)&delta_1 + 1),(uchar)delta_1._2_2_);
      if ((uint)delta < recent) {
        iStack_108 = recent - delta;
        if (iStack_108 < 8 - bias) {
LAB_00111e31:
          Counter<unsigned_short,_16U>::Counter(&local_110,(ThisType *)((long)&delta_1 + 2));
          Counter<unsigned_char,_4U>::Counter
                    ((Counter<unsigned_char,_4U> *)&local_111,&truncatedRecent);
          local_a8 = &local_10e;
          local_b0 = &local_110;
          puStack_b8 = &local_111;
          absDiff_1 = (unsigned_short)bias;
          local_88 = &local_111;
          local_78 = &local_110;
          Counter<unsigned_short,_16U>::Counter
                    (&local_10e,(ushort)local_111 | local_110.Value & 0xfff0);
          local_80 = &local_110;
          local_bc = local_110.Value & 0xf;
          local_90 = &local_111;
          if (local_bc < local_111) {
            local_98 = &local_111;
            local_be = local_111 - local_bc;
            if ((ushort)(8 - absDiff_1) <= local_be) {
              Counter<unsigned_short,_16U>::Counter(&local_c0,0x10);
              local_20 = &local_10e;
              local_28 = &local_c0;
              local_10e.Value = local_10e.Value - local_c0.Value;
            }
          }
          else {
            result = (ThisType *)&local_111;
            local_c2 = local_bc - local_111;
            if ((ushort)(absDiff_1 + 8) < local_c2) {
              Counter<unsigned_short,_16U>::Counter(&local_c4,0x10);
              local_10 = &local_10e;
              local_18 = &local_c4;
              local_10e.Value = local_10e.Value + local_c4.Value;
            }
          }
          local_58 = &local_10e;
          local_60 = &fullRecent;
          if (local_10e.Value != fullRecent.Value) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_short,_16U>::Counter(&local_116,(ThisType *)((long)&delta_1 + 2));
            Counter<unsigned_char,_4U>::Counter(&local_117,&truncatedRecent);
            local_30 = &local_114;
            local_38 = &local_116;
            _gapMSB = &local_117;
            gapSigned = local_117.Value & 8;
            local_44 = (ushort)local_117.Value + gapSigned * -2;
            local_45 = (byte)local_116.Value & 0xf;
            local_46 = (char)local_44 - local_45 & 0xf;
            local_48 = local_46 & 8;
            local_4a = (ushort)local_46 + local_48 * -2;
            Counter<unsigned_short,_16U>::Counter(&local_114,local_116.Value + local_4a);
            Counter<unsigned_short,_16U>::operator=(&local_10e,&local_114);
            local_68 = &local_10e;
            local_70 = &fullRecent;
            if (local_10e.Value != fullRecent.Value) {
              return false;
            }
          }
        }
      }
      else {
        local_10c = delta - recent;
        if (local_10c <= bias + 8) goto LAB_00111e31;
      }
    }
    recent = recent + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}